

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this,int overrun,int d)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  undefined8 uVar4;
  int iVar5;
  char *in_RAX;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  size_t __n;
  pair<const_char_*,_int> pVar11;
  void *data;
  char *local_38;
  
  pcVar9 = this->next_chunk_;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar1 = this->buffer_;
    if (pcVar9 == pcVar1) {
      uVar4 = *(undefined8 *)(this->buffer_end_ + 8);
      *(undefined8 *)pcVar1 = *(undefined8 *)this->buffer_end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar4;
      if (this->overall_limit_ < 1) {
LAB_00282e80:
        if (this->aliasing_ == 2) {
          this->aliasing_ = (long)this->buffer_end_ - (long)pcVar9;
        }
        this->next_chunk_ = (char *)0x0;
        this->buffer_end_ = this->buffer_ + 0x10;
        this->size_ = 0;
        pcVar9 = pcVar1;
      }
      else {
        local_38 = in_RAX;
        if ((-1 < d) && (overrun < 0x10)) {
          pcVar2 = this->buffer_ + 0x10;
          pcVar6 = pcVar1 + overrun;
          do {
            bVar3 = *pcVar6;
            uVar8 = (uint)bVar3;
            pcVar7 = pcVar6 + 1;
            if ((char)bVar3 < '\0') {
              uVar8 = ((uint)bVar3 + (uint)(byte)*pcVar7 * 0x80) - 0x80;
              if (*pcVar7 < '\0') {
                pcVar7 = pcVar6 + 3;
                lVar10 = -0x15;
                while (uVar8 = ((byte)pcVar7[-1] - 1 << ((char)lVar10 + 0x23U & 0x1f)) + uVar8,
                      pcVar7[-1] < '\0') {
                  pcVar7 = pcVar7 + 1;
                  lVar10 = lVar10 + 7;
                  if (lVar10 == 0) goto switchD_00282d83_default;
                }
              }
              else {
                pcVar7 = pcVar6 + 2;
              }
            }
            if (pcVar2 < pcVar7) break;
            if (uVar8 == 0) goto LAB_00282e80;
            switch(uVar8 & 7) {
            case 0:
              pcVar7 = VarintParse<unsigned_long>(pcVar7,(unsigned_long *)&local_38);
              if (pcVar7 == (char *)0x0) goto switchD_00282d83_default;
              break;
            case 1:
              pcVar7 = pcVar7 + 8;
              break;
            case 2:
              uVar8 = (uint)(byte)*pcVar7;
              if (*pcVar7 < '\0') {
                pVar11 = ReadSizeFallback(pcVar7,uVar8);
                uVar8 = pVar11.second;
                pcVar7 = pVar11.first;
                if (pcVar7 == (char *)0x0) goto switchD_00282d83_default;
              }
              else {
                pcVar7 = pcVar7 + 1;
              }
              if ((long)pcVar2 - (long)pcVar7 < (long)(int)uVar8) goto switchD_00282d83_default;
              pcVar7 = pcVar7 + (int)uVar8;
              break;
            case 3:
              d = d + 1;
              break;
            case 4:
              if (d < 1) goto LAB_00282e80;
              d = d + -1;
              break;
            case 5:
              pcVar7 = pcVar7 + 4;
              break;
            default:
              goto switchD_00282d83_default;
            }
            pcVar6 = pcVar7;
          } while (pcVar7 < pcVar2);
        }
switchD_00282d83_default:
        do {
          iVar5 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_38,&this->size_);
          if ((char)iVar5 == '\0') {
            this->overall_limit_ = 0;
            goto LAB_00282e80;
          }
          iVar5 = this->size_;
          __n = (size_t)iVar5;
          this->overall_limit_ = this->overall_limit_ - iVar5;
          if (0x10 < (long)__n) {
            uVar4 = *(undefined8 *)(local_38 + 8);
            *(undefined8 *)(this->buffer_ + 0x10) = *(undefined8 *)local_38;
            *(undefined8 *)(this->buffer_ + 0x18) = uVar4;
            this->next_chunk_ = local_38;
            this->buffer_end_ = this->buffer_ + 0x10;
            if (this->aliasing_ < 2) {
              return pcVar1;
            }
            goto LAB_00282ecb;
          }
        } while (iVar5 < 1);
        memcpy(this->buffer_ + 0x10,local_38,__n);
        this->next_chunk_ = pcVar1;
        this->buffer_end_ = pcVar1 + __n;
        pcVar9 = pcVar1;
        if (1 < this->aliasing_) {
LAB_00282ecb:
          this->aliasing_ = 1;
          pcVar9 = pcVar1;
        }
      }
    }
    else {
      this->buffer_end_ = pcVar9 + (long)this->size_ + -0x10;
      this->next_chunk_ = pcVar1;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return pcVar9;
}

Assistant:

const char* EpsCopyInputStream::Next(int overrun, int d) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (d < 0 || !ParseEndsInSlopRegion(buffer_, overrun, d))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}